

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_icdf<trng::extreme_value_dist<float>>(extreme_value_dist<float> *d)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  StringRef capturedExpression;
  bool bVar1;
  reference pvVar2;
  reference pfVar3;
  int iVar4;
  undefined8 in_RDI;
  float extraout_XMM0_Da;
  double dVar5;
  undefined4 uVar6;
  AssertionHandler catchAssertionHandler;
  result_type y;
  result_type x;
  float p;
  iterator __end0;
  iterator __begin0;
  vector<float,_std::allocator<float>_> *__range1;
  int i;
  vector<float,_std::allocator<float>_> p_values;
  float eps;
  undefined4 in_stack_fffffffffffffe88;
  result_type_conflict1 in_stack_fffffffffffffe8c;
  ExprLhs<const_float_&> in_stack_fffffffffffffe90;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffe98;
  result_type_conflict1 in_stack_fffffffffffffea0;
  result_type_conflict1 in_stack_fffffffffffffea4;
  vector<float,_std::allocator<float>_> *pvVar7;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffeb0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffeb8;
  SourceLineInfo local_e8;
  StringRef local_d8;
  undefined1 local_c8 [76];
  result_type_conflict1 local_7c;
  result_type_conflict1 local_78;
  float local_74;
  float *local_70;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_68;
  vector<float,_std::allocator<float>_> *local_60;
  float *local_58;
  float *local_50;
  float local_48;
  float local_44;
  int local_40;
  undefined4 local_2c;
  vector<float,_std::allocator<float>_> local_28;
  float local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_c = Catch::clara::std::numeric_limits<float>::epsilon();
  uVar6 = 0;
  local_c = local_c * 256.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x321cbb);
  local_2c = 0x3f000000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe90.m_lhs,
             (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  for (local_40 = 2; local_40 < 0x18; local_40 = local_40 + 1) {
    in_stack_fffffffffffffeb8 = &local_28;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_fffffffffffffeb8,0);
    dVar5 = std::pow((double)(ulong)(uint)*pvVar2,(double)CONCAT44(uVar6,(float)local_40));
    uVar6 = 0;
    local_44 = SUB84(dVar5,0) + 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe90.m_lhs,
               (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
              );
    in_stack_fffffffffffffeb0 = &local_28;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_fffffffffffffeb0,0);
    dVar5 = std::pow((double)(ulong)(uint)*pvVar2,(double)CONCAT44(uVar6,(float)local_40));
    uVar6 = (undefined4)((ulong)dVar5 >> 0x20);
    local_48 = 1.0 - SUB84(dVar5,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe90.m_lhs,
               (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
              );
  }
  pvVar7 = &local_28;
  local_50 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_58 = (float *)std::vector<float,_std::allocator<float>_>::end
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __first._M_current._4_4_ = in_stack_fffffffffffffea4;
  __first._M_current._0_4_ = in_stack_fffffffffffffea0;
  std::sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            (__first,in_stack_fffffffffffffe98);
  local_60 = &local_28;
  local_68._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_70 = (float *)std::vector<float,_std::allocator<float>_>::end
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       in_stack_fffffffffffffe90.m_lhs,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (!bVar1) break;
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_68);
    local_74 = *pfVar3;
    in_stack_fffffffffffffea4 =
         trng::extreme_value_dist<float>::icdf
                   ((extreme_value_dist<float> *)in_stack_fffffffffffffe98._M_current,
                    (result_type_conflict1)((ulong)in_stack_fffffffffffffe90.m_lhs >> 0x20));
    iVar4 = (int)local_8;
    local_78 = in_stack_fffffffffffffea4;
    in_stack_fffffffffffffea0 =
         trng::extreme_value_dist<float>::cdf
                   ((extreme_value_dist<float> *)in_stack_fffffffffffffe90.m_lhs,
                    in_stack_fffffffffffffe8c);
    local_7c = in_stack_fffffffffffffea0;
    Catch::clara::std::abs(iVar4);
    if (3.0517578e-05 <= extraout_XMM0_Da) {
      local_d8 = operator____catch_sr
                           ((char *)in_stack_fffffffffffffe90.m_lhs,
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      in_stack_fffffffffffffe98._M_current = (float *)&local_e8;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffffe98._M_current,
                 "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
                 ,0xa8);
      Catch::StringRef::StringRef
                ((StringRef *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (char *)in_stack_fffffffffffffe98._M_current);
      iVar4 = (int)local_c8;
      capturedExpression.m_size = (size_type)in_stack_fffffffffffffeb0;
      capturedExpression.m_start = (char *)pvVar7;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (StringRef *)in_stack_fffffffffffffe98._M_current,
                 (SourceLineInfo *)in_stack_fffffffffffffe90.m_lhs,capturedExpression,
                 (Flags)in_stack_fffffffffffffe8c);
      Catch::clara::std::abs(iVar4);
      in_stack_fffffffffffffe90 =
           Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (float *)0x321fb5);
      Catch::ExprLhs<float_const&>::operator<
                ((ExprLhs<const_float_&> *)in_stack_fffffffffffffeb8,
                 (float *)in_stack_fffffffffffffeb0);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffffe90.m_lhs,
                 (ITransientExpression *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
                ((BinaryExpr<const_float_&,_const_float_&> *)0x321ffd);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffe90.m_lhs);
      Catch::AssertionHandler::~AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffe90.m_lhs);
    }
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_68);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}